

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_CorruptedDescriptor::_Run(_Test_CorruptedDescriptor *this)

{
  DBImpl *this_00;
  Status s;
  string v;
  undefined1 local_220 [16];
  Status local_210;
  Comparator *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [24];
  Tester local_1c8;
  
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x124;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_220[0] = 0;
  local_200._M_dataplus._M_p = "foo";
  local_200._M_string_length = 3;
  local_1e0._8_8_ = "hello";
  local_1e0._16_8_ = (_func_int **)0x5;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_210);
  test::Tester::IsOk(&local_1c8,&local_210);
  if (local_210.state_ != (char *)0x0) {
    operator_delete__(local_210.state_);
  }
  test::Tester::~Tester(&local_1c8);
  this_00 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)local_1e0);
  if ((_func_int **)local_1e0._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_1e0._0_8_);
  }
  DBImpl::TEST_CompactRange(this_00,0,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kDescriptorFile,0,1000);
  CorruptionTest::TryReopen((CorruptionTest *)local_220);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 299;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  test::Tester::Is(&local_1c8,CONCAT71(local_220._1_7_,local_220[0]) != 0,"!s.ok()");
  test::Tester::~Tester(&local_1c8);
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x130;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_1e0._16_8_ = (_func_int **)0x0;
  local_1e0._8_8_ = (Cache *)0x100;
  local_210.state_ = "foo";
  local_208 = (Comparator *)0x3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(local_220 + 8);
  test::Tester::IsOk(&local_1c8,(Status *)(local_220 + 8));
  if ((Env *)local_220._8_8_ != (Env *)0x0) {
    operator_delete__((void *)local_220._8_8_);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x131;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  test::Tester::IsEq<char[6],std::__cxx11::string>(&local_1c8,(char (*) [6])"hello",&local_200);
  test::Tester::~Tester(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((void *)CONCAT71(local_220._1_7_,local_220[0]) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_220._1_7_,local_220[0]));
  }
  return;
}

Assistant:

TEST(CorruptionTest, CorruptedDescriptor) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "hello"));
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);

  Corrupt(kDescriptorFile, 0, 1000);
  Status s = TryReopen();
  ASSERT_TRUE(!s.ok());

  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("hello", v);
}